

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_32f82::Boid::reset(Boid *this)

{
  ProximityToken *pPVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined8 extraout_XMM0_Qa;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar4;
  undefined1 auVar5 [16];
  Vec3 VVar6;
  undefined8 local_48;
  float local_40;
  float local_38;
  undefined1 local_28 [16];
  
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1f])(0x41d80000,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x21])(0x41100000,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1c])
            (CONCAT44((int)((ulong)extraout_XMM0_Qa >> 0x20),(float)extraout_XMM0_Qa * 0.3),this);
  VVar6 = OpenSteer::RandomVectorInUnitRadiusSphere();
  fVar4 = VVar6.z;
  auVar5._0_8_ = VVar6._0_8_;
  auVar5._8_4_ = extraout_XMM0_Dc;
  auVar5._12_4_ = extraout_XMM0_Dd;
  fVar3 = fVar4 * fVar4 + VVar6.x * VVar6.x + VVar6.y * VVar6.y;
  if (fVar3 < 0.0) {
    local_38 = fVar4;
    local_28 = auVar5;
    fVar3 = sqrtf(fVar3);
    fVar4 = local_38;
    auVar5 = local_28;
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  local_48 = auVar5._0_8_;
  if (0.0 < fVar3) {
    auVar2._4_4_ = fVar3;
    auVar2._0_4_ = fVar3;
    auVar2._8_4_ = fVar3;
    auVar2._12_4_ = fVar3;
    auVar5 = divps(auVar5,auVar2);
    local_48 = auVar5._0_8_;
  }
  local_40 = (float)(~-(uint)(0.0 < fVar3) & (uint)fVar4 |
                    (uint)(fVar4 / fVar3) & -(uint)(0.0 < fVar3));
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x11])(this,&local_48);
  VVar6 = OpenSteer::RandomVectorInUnitRadiusSphere();
  fVar4 = VVar6.z * 20.0;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[9])(CONCAT44(VVar6.y * 20.0,VVar6.x * 20.0),this);
  pPVar1 = this->proximityToken;
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  local_40 = fVar4;
  (*pPVar1->_vptr_AbstractTokenForProximityDatabase[2])(pPVar1,&local_48);
  return;
}

Assistant:

void reset (void)
        {
            // reset the vehicle
            SimpleVehicle::reset ();

            // steering force is clipped to this magnitude
            setMaxForce (27);

            // velocity is clipped to this magnitude
            setMaxSpeed (9);

            // initial slow speed
            setSpeed (maxSpeed() * 0.3f);

            // randomize initial orientation
            regenerateOrthonormalBasisUF (RandomUnitVector ());

            // randomize initial position
            setPosition (RandomVectorInUnitRadiusSphere () * 20);

            // notify proximity database that our position has changed
            proximityToken->updateForNewPosition (position());
        }